

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

char * mc2str(int mc)

{
  int mc_local;
  char *local_8;
  
  switch(mc) {
  case 1:
    local_8 = "Beta 1.7";
    break;
  case 2:
    local_8 = "Beta 1.8";
    break;
  case 3:
    local_8 = "1.0";
    break;
  case 4:
    local_8 = "1.1";
    break;
  case 5:
    local_8 = "1.2";
    break;
  case 6:
    local_8 = "1.3";
    break;
  case 7:
    local_8 = "1.4";
    break;
  case 8:
    local_8 = "1.5";
    break;
  case 9:
    local_8 = "1.6";
    break;
  case 10:
    local_8 = "1.7";
    break;
  case 0xb:
    local_8 = "1.8";
    break;
  case 0xc:
    local_8 = "1.9";
    break;
  case 0xd:
    local_8 = "1.10";
    break;
  case 0xe:
    local_8 = "1.11";
    break;
  case 0xf:
    local_8 = "1.12";
    break;
  case 0x10:
    local_8 = "1.13";
    break;
  case 0x11:
    local_8 = "1.14";
    break;
  case 0x12:
    local_8 = "1.15";
    break;
  case 0x13:
    local_8 = "1.16.1";
    break;
  case 0x14:
    local_8 = "1.16";
    break;
  case 0x15:
    local_8 = "1.17";
    break;
  case 0x16:
    local_8 = "1.18";
    break;
  case 0x17:
    local_8 = "1.19.2";
    break;
  case 0x18:
    local_8 = "1.19";
    break;
  case 0x19:
    local_8 = "1.20";
    break;
  case 0x1a:
    local_8 = "1.21.1";
    break;
  case 0x1b:
    local_8 = "1.21.3";
    break;
  case 0x1c:
    local_8 = "1.21 WD";
    break;
  default:
    local_8 = "?";
  }
  return local_8;
}

Assistant:

const char* mc2str(int mc)
{
    switch (mc)
    {
    case MC_B1_7:   return "Beta 1.7"; break;
    case MC_B1_8:   return "Beta 1.8"; break;
    case MC_1_0:    return "1.0"; break;
    case MC_1_1:    return "1.1"; break;
    case MC_1_2:    return "1.2"; break;
    case MC_1_3:    return "1.3"; break;
    case MC_1_4:    return "1.4"; break;
    case MC_1_5:    return "1.5"; break;
    case MC_1_6:    return "1.6"; break;
    case MC_1_7:    return "1.7"; break;
    case MC_1_8:    return "1.8"; break;
    case MC_1_9:    return "1.9"; break;
    case MC_1_10:   return "1.10"; break;
    case MC_1_11:   return "1.11"; break;
    case MC_1_12:   return "1.12"; break;
    case MC_1_13:   return "1.13"; break;
    case MC_1_14:   return "1.14"; break;
    case MC_1_15:   return "1.15"; break;
    case MC_1_16_1: return "1.16.1"; break;
    case MC_1_16:   return "1.16"; break;
    case MC_1_17:   return "1.17"; break;
    case MC_1_18:   return "1.18"; break;
    case MC_1_19_2: return "1.19.2"; break;
    case MC_1_19:   return "1.19"; break;
    case MC_1_20:   return "1.20"; break;
    case MC_1_21_1: return "1.21.1"; break;
    case MC_1_21_3: return "1.21.3"; break;
    case MC_1_21_WD: return "1.21 WD"; break;
    default:        return "?";
    }
}